

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArray.H
# Opt level: O0

void __thiscall
amrex::FabArray<amrex::BaseFab<long>_>::FabArray
          (FabArray<amrex::BaseFab<long>_> *this,BoxArray *bxs,DistributionMapping *dm,int nvar,
          IntVect *ngrow,MFInfo *info,FabFactory<amrex::BaseFab<long>_> *factory)

{
  type pFVar1;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  long *in_stack_00000008;
  pointer in_stack_ffffffffffffff38;
  FabArrayStats *in_stack_ffffffffffffff40;
  FabArrayBase *in_stack_ffffffffffffff50;
  
  FabArrayBase::FabArrayBase(in_stack_ffffffffffffff50);
  *in_RDI = (long)&PTR__FabArray_01802ff0;
  (**(code **)(*in_stack_00000008 + 0x28))();
  std::
  unique_ptr<amrex::FabFactory<amrex::BaseFab<long>>,std::default_delete<amrex::FabFactory<amrex::BaseFab<long>>>>
  ::unique_ptr<std::default_delete<amrex::FabFactory<amrex::BaseFab<long>>>,void>
            ((unique_ptr<amrex::FabFactory<amrex::BaseFab<long>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<long>_>_>_>
              *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  DataAllocator::DataAllocator((DataAllocator *)(in_RDI + 0x1f));
  *(undefined1 *)(in_RDI + 0x20) = 0;
  std::vector<amrex::BaseFab<long>_*,_std::allocator<amrex::BaseFab<long>_*>_>::vector
            ((vector<amrex::BaseFab<long>_*,_std::allocator<amrex::BaseFab<long>_*>_> *)0x1046135);
  in_RDI[0x24] = 0;
  MultiArray4<long>::MultiArray4((MultiArray4<long> *)(in_RDI + 0x25));
  MultiArray4<const_long>::MultiArray4((MultiArray4<const_long> *)(in_RDI + 0x26));
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1046178);
  ShMem::ShMem((ShMem *)(in_RDI + 0x2a));
  std::
  unique_ptr<amrex::FBData<amrex::BaseFab<long>>,std::default_delete<amrex::FBData<amrex::BaseFab<long>>>>
  ::unique_ptr<std::default_delete<amrex::FBData<amrex::BaseFab<long>>>,void>
            ((unique_ptr<amrex::FBData<amrex::BaseFab<long>_>,_std::default_delete<amrex::FBData<amrex::BaseFab<long>_>_>_>
              *)in_stack_ffffffffffffff40);
  std::
  unique_ptr<amrex::PCData<amrex::BaseFab<long>>,std::default_delete<amrex::PCData<amrex::BaseFab<long>>>>
  ::unique_ptr<std::default_delete<amrex::PCData<amrex::BaseFab<long>>>,void>
            ((unique_ptr<amrex::PCData<amrex::BaseFab<long>_>,_std::default_delete<amrex::PCData<amrex::BaseFab<long>_>_>_>
              *)in_stack_ffffffffffffff40);
  std::
  unique_ptr<amrex::FabArray<amrex::BaseFab<long>>,std::default_delete<amrex::FabArray<amrex::BaseFab<long>>>>
  ::unique_ptr<std::default_delete<amrex::FabArray<amrex::BaseFab<long>>>,void>
            ((unique_ptr<amrex::FabArray<amrex::BaseFab<long>_>,_std::default_delete<amrex::FabArray<amrex::BaseFab<long>_>_>_>
              *)in_stack_ffffffffffffff40);
  FabArrayBase::FabArrayStats::recordBuild(in_stack_ffffffffffffff40);
  pFVar1 = std::
           unique_ptr<amrex::FabFactory<amrex::BaseFab<long>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<long>_>_>_>
           ::operator*((unique_ptr<amrex::FabFactory<amrex::BaseFab<long>_>,_std::default_delete<amrex::FabFactory<amrex::BaseFab<long>_>_>_>
                        *)in_stack_ffffffffffffff40);
  (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI,in_RDX,in_ECX,in_R8,in_R9,pFVar1);
  return;
}

Assistant:

FabArray<FAB>::FabArray (const BoxArray&            bxs,
                         const DistributionMapping& dm,
                         int                        nvar,
                         const IntVect&             ngrow,
                         const MFInfo&              info,
                         const FabFactory<FAB>&     factory)
    : m_factory(factory.clone()),
      shmem()
{
    m_FA_stats.recordBuild();
    define(bxs,dm,nvar,ngrow,info,*m_factory);
}